

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O2

Face * __thiscall HalfMesh::Mesh::get_face(Mesh *this,uint i)

{
  iterator iVar1;
  mapped_type *ppFVar2;
  mapped_type pFVar3;
  uint local_c;
  
  local_c = i;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_HalfMesh::Face_*>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->face_handle_to_face_map)._M_h,&local_c);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_HalfMesh::Face_*>,_false>._M_cur
      == (__node_type *)0x0) {
    pFVar3 = (Face *)0x0;
  }
  else {
    ppFVar2 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_HalfMesh::Face_*>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_HalfMesh::Face_*>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->face_handle_to_face_map,&local_c);
    pFVar3 = *ppFVar2;
  }
  return pFVar3;
}

Assistant:

Face *get_face(unsigned int i) {
            Face *new_face = NULL_FACE;
            if (face_handle_to_face_map.find(i) != face_handle_to_face_map.end()) {
                return face_handle_to_face_map[i];
            } else {
                return new_face;
            }
        }